

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_string(char *text,int text_len,int posX,int posY,int fontSize,rf_color color)

{
  rf_vec2 position;
  
  if ((text_len != 0) && ((rf__ctx->field_0).default_font.texture.id != 0)) {
    position.x = (float)posX;
    position.y = (float)posY;
    if (fontSize < 0xb) {
      fontSize = 10;
    }
    rf_draw_string_ex((rf__ctx->field_0).default_font,text,text_len,position,(float)fontSize,
                      (float)((uint)fontSize / 10),color);
  }
  return;
}

Assistant:

RF_API void rf_draw_string(const char* text, int text_len, int posX, int posY, int fontSize, rf_color color)
{
    // Check if default font has been loaded
    if (rf_get_default_font().texture.id == 0 || text_len == 0) return;

    rf_vec2 position = { (float)posX, (float)posY };

    int defaultFontSize = 10;   // Default Font chars height in pixel
    if (fontSize < defaultFontSize) fontSize = defaultFontSize;
    int spacing = fontSize/defaultFontSize;

    rf_draw_string_ex(rf_get_default_font(), text, text_len, position, (float)fontSize, (float)spacing, color);
}